

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O3

RC __thiscall PF_HashTable::Find(PF_HashTable *this,int fd,PageNum pageNum,int *slot)

{
  ulong uVar1;
  PF_HashEntry *pPVar2;
  
  uVar1 = (long)(pageNum + fd) % (long)this->numBuckets;
  if (-1 < (int)uVar1) {
    for (pPVar2 = this->hashTable[uVar1 & 0xffffffff]; pPVar2 != (PF_HashEntry *)0x0;
        pPVar2 = pPVar2->next) {
      if ((pPVar2->fd == fd) && (pPVar2->pageNum == pageNum)) {
        *slot = pPVar2->slot;
        return 0;
      }
    }
  }
  return -8;
}

Assistant:

RC PF_HashTable::Find(int fd, PageNum pageNum, int &slot)
{
  // Get which bucket it should be in
  int bucket = Hash(fd, pageNum);

  if (bucket<0)
     return (PF_HASHNOTFOUND);

  // Go through the linked list of this bucket
  for (PF_HashEntry *entry = hashTable[bucket];
       entry != NULL;
       entry = entry->next) {
    if (entry->fd == fd && entry->pageNum == pageNum) {

      // Found it
      slot = entry->slot;
      return (0);
    }
  }

  // Didn't find it
  return (PF_HASHNOTFOUND);
}